

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

qint64 __thiscall
QHttpMultiPartIODevice::readData(QHttpMultiPartIODevice *this,char *data,qint64 maxSize)

{
  ulong uVar1;
  QHttpPartPrivate *pQVar2;
  bool bVar3;
  qsizetype qVar4;
  QHttpMultiPartPrivate *pQVar5;
  qint64 qVar6;
  size_t sVar7;
  pointer pQVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  size_t __n;
  long in_FS_OFFSET;
  qint64 local_98;
  QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]> local_70;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = this->multiPart;
  if ((pQVar5->parts).d.size == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    do {
      lVar12 = this->readPointer;
      lVar10 = (this->partOffsets).d.ptr[uVar13];
      qVar6 = QHttpPartPrivate::size((pQVar5->parts).d.ptr[uVar13].d.d.ptr);
      if (lVar12 < qVar6 + lVar10 + (this->multiPart->boundary).d.size + 6) break;
      uVar13 = uVar13 + 1;
      pQVar5 = this->multiPart;
    } while (uVar13 < (ulong)(pQVar5->parts).d.size);
  }
  lVar12 = 0;
  while (__n = maxSize - lVar12, lVar10 = lVar12, __n != 0 && lVar12 <= maxSize) {
    pQVar5 = this->multiPart;
    uVar1 = (pQVar5->parts).d.size;
    if ((long)uVar1 <= (long)uVar13) {
      if (uVar13 == uVar1) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_70.a.b = &pQVar5->boundary;
        local_70.a.a = (char (*) [3])0x268e3d;
        local_70.b = (char (*) [5])0x26d8c1;
        QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]>::
        convertTo<QByteArray>(&local_58,&local_70);
        qVar4 = local_58.d.size;
        lVar10 = this->readPointer;
        lVar9 = (**(code **)(*(long *)this + 0x80))(this);
        sVar7 = local_58.d.size - (long)(qVar4 + (lVar10 - lVar9));
        if ((long)__n <= (long)sVar7) {
          sVar7 = __n;
        }
        pcVar11 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar11 = (char *)&QByteArray::_empty;
        }
        memcpy(data + lVar12,pcVar11 + (long)(qVar4 + (lVar10 - lVar9)),sVar7);
        this->readPointer = this->readPointer + sVar7;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
        lVar10 = sVar7 + lVar12;
      }
      break;
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_70.a.b = &pQVar5->boundary;
    local_70.a.a = (char (*) [3])0x268e3d;
    local_70.b = (char (*) [5])0x26edec;
    QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]> *
               )&local_70);
    qVar4 = local_58.d.size;
    lVar10 = this->readPointer - (this->partOffsets).d.ptr[uVar13];
    sVar7 = local_58.d.size - lVar10;
    if (sVar7 != 0 && lVar10 <= local_58.d.size) {
      if ((long)sVar7 < (long)__n) {
        __n = sVar7;
      }
      pcVar11 = local_58.d.ptr;
      if (local_58.d.ptr == (char *)0x0) {
        pcVar11 = (char *)&QByteArray::_empty;
      }
      memcpy(data + lVar12,pcVar11 + lVar10,__n);
      lVar12 = lVar12 + __n;
      this->readPointer = this->readPointer + __n;
      lVar10 = lVar10 + __n;
    }
    if (((maxSize - lVar12 == 0 || maxSize < lVar12) || (lVar10 < qVar4)) ||
       (qVar6 = QHttpPartPrivate::size((this->multiPart->parts).d.ptr[uVar13].d.d.ptr),
       (long)(qVar4 + qVar6) <= lVar10)) {
LAB_001fecf6:
      bVar3 = true;
      if ((lVar12 < maxSize) &&
         (qVar6 = QHttpPartPrivate::size((this->multiPart->parts).d.ptr[uVar13].d.d.ptr),
         (long)(qVar4 + qVar6) <= lVar10)) {
        if (lVar12 == maxSize + -1) {
          bVar3 = false;
          local_98 = lVar12;
        }
        else {
          (data + lVar12)[0] = '\r';
          (data + lVar12)[1] = '\n';
          lVar12 = lVar12 + 2;
          this->readPointer = this->readPointer + 2;
          uVar13 = uVar13 + 1;
        }
      }
    }
    else {
      pQVar8 = QList<QHttpPart>::data(&this->multiPart->parts);
      pQVar8 = pQVar8 + uVar13;
      pQVar2 = (pQVar8->d).d.ptr;
      if ((pQVar2 != (QHttpPartPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QHttpPartPrivate>::detach_helper(&pQVar8->d);
      }
      qVar6 = QHttpPartPrivate::readData((pQVar8->d).d.ptr,data + lVar12,maxSize - lVar12);
      if (qVar6 != -1) {
        lVar12 = lVar12 + qVar6;
        this->readPointer = this->readPointer + qVar6;
        lVar10 = lVar10 + qVar6;
        goto LAB_001fecf6;
      }
      local_98 = -1;
      bVar3 = false;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    lVar10 = local_98;
    if (!bVar3) break;
  }
  local_98 = lVar10;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_98;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpMultiPartIODevice::readData(char *data, qint64 maxSize)
{
    qint64 bytesRead = 0, index = 0;

    // skip the parts we have already read
    while (index < multiPart->parts.size() &&
           readPointer >= partOffsets.at(index) + multiPart->parts.at(index).d->size()
           + multiPart->boundary.size() + 6) // 6 == 2 boundary dashes, \r\n after boundary, \r\n after multipart
        index++;

    // read the data
    while (bytesRead < maxSize && index < multiPart->parts.size()) {

        // check whether we need to read the boundary of the current part
        QByteArray boundaryData = "--" + multiPart->boundary + "\r\n";
        qint64 boundaryCount = boundaryData.size();
        qint64 partIndex = readPointer - partOffsets.at(index);
        if (partIndex < boundaryCount) {
            qint64 boundaryBytesRead = qMin(boundaryCount - partIndex, maxSize - bytesRead);
            memcpy(data + bytesRead, boundaryData.constData() + partIndex, boundaryBytesRead);
            bytesRead += boundaryBytesRead;
            readPointer += boundaryBytesRead;
            partIndex += boundaryBytesRead;
        }

        // check whether we need to read the data of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount && partIndex < boundaryCount + multiPart->parts.at(index).d->size()) {
            qint64 dataBytesRead = multiPart->parts[index].d->readData(data + bytesRead, maxSize - bytesRead);
            if (dataBytesRead == -1)
                return -1;
            bytesRead += dataBytesRead;
            readPointer += dataBytesRead;
            partIndex += dataBytesRead;
        }

        // check whether we need to read the ending CRLF of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount + multiPart->parts.at(index).d->size()) {
            if (bytesRead == maxSize - 1)
                return bytesRead;
            memcpy(data + bytesRead, "\r\n", 2);
            bytesRead += 2;
            readPointer += 2;
            index++;
        }
    }
    // check whether we need to return the final boundary
    if (bytesRead < maxSize && index == multiPart->parts.size()) {
        QByteArray finalBoundary = "--" + multiPart->boundary + "--\r\n";
        qint64 boundaryIndex = readPointer + finalBoundary.size() - size();
        qint64 lastBoundaryBytesRead = qMin(finalBoundary.size() - boundaryIndex, maxSize - bytesRead);
        memcpy(data + bytesRead, finalBoundary.constData() + boundaryIndex, lastBoundaryBytesRead);
        bytesRead += lastBoundaryBytesRead;
        readPointer += lastBoundaryBytesRead;
    }
    return bytesRead;
}